

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::ExtractSnapObjectDataIntoSnapScriptFunctionInfo
          (ScriptFunction *this,void *snapScriptFunctionInfo,SlabAllocator *alloc)

{
  SnapScriptFunctionInfo *this_00;
  uint16 uVar1;
  int iVar2;
  ParseableFunctionInfo *pfi;
  undefined4 extraout_var;
  ActivationObjectEx **ppAVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void **ppvVar4;
  undefined4 extraout_var_02;
  void *local_40;
  Type local_38;
  FrameDisplay *environment;
  FunctionBody *fb;
  SnapScriptFunctionInfo *ssfi;
  SlabAllocator *alloc_local;
  void *snapScriptFunctionInfo_local;
  ScriptFunction *this_local;
  
  fb = (FunctionBody *)snapScriptFunctionInfo;
  ssfi = (SnapScriptFunctionInfo *)alloc;
  alloc_local = (SlabAllocator *)snapScriptFunctionInfo;
  snapScriptFunctionInfo_local = this;
  pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
  environment = (FrameDisplay *)TTD::JsSupport::ForceAndGetFunctionBody(pfi);
  this_00 = ssfi;
  iVar2 = (*(((FunctionBody *)environment)->super_ParseableFunctionInfo).super_FunctionProxy.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
  TTD::SlabAllocatorBase<0>::CopyNullTermStringInto
            ((SlabAllocatorBase<0> *)this_00,(char16 *)CONCAT44(extraout_var,iVar2),(TTString *)fb);
  (fb->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr =
       (FunctionInfo *)environment;
  local_38 = (Type)GetEnvironment(this);
  (fb->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext = (Type)0x0;
  uVar1 = FrameDisplay::GetLength((FrameDisplay *)local_38);
  if (uVar1 != 0) {
    (fb->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext = local_38;
  }
  (fb->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr = (Utf8SourceInfo *)0x0
  ;
  ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_ActivationObjectEx__
                      ((WriteBarrierPtr *)&this->cachedScopeObj);
  if (*ppAVar3 != (ActivationObjectEx *)0x0) {
    ppAVar3 = Memory::PointerValue<Js::ActivationObjectEx>(&this->cachedScopeObj);
    (fb->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr =
         (Utf8SourceInfo *)*ppAVar3;
  }
  (fb->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr =
       (ScriptFunctionType *)0x0;
  iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x73])();
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x73])();
    local_40 = (void *)CONCAT44(extraout_var_01,iVar2);
    ppvVar4 = Memory::PointerValue<void>(&local_40);
    (fb->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr =
         (ScriptFunctionType *)*ppvVar4;
  }
  iVar2 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x76])();
  (fb->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr =
       (ScriptFunctionType *)CONCAT44(extraout_var_02,iVar2);
  return;
}

Assistant:

void ScriptFunction::ExtractSnapObjectDataIntoSnapScriptFunctionInfo(/*TTD::NSSnapObjects::SnapScriptFunctionInfo* */ void* snapScriptFunctionInfo, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapScriptFunctionInfo* ssfi = reinterpret_cast<TTD::NSSnapObjects::SnapScriptFunctionInfo*>(snapScriptFunctionInfo);

        Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(this->GetParseableFunctionInfo());

        alloc.CopyNullTermStringInto(fb->GetDisplayName(), ssfi->DebugFunctionName);

        ssfi->BodyRefId = TTD_CONVERT_FUNCTIONBODY_TO_PTR_ID(fb);

        Js::FrameDisplay* environment = this->GetEnvironment();
        ssfi->ScopeId = TTD_INVALID_PTR_ID;
        if (environment->GetLength() != 0)
        {
            ssfi->ScopeId = TTD_CONVERT_SCOPE_TO_PTR_ID(environment);
        }

        ssfi->CachedScopeObjId = TTD_INVALID_PTR_ID;
        if (this->cachedScopeObj != nullptr)
        {
            ssfi->CachedScopeObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->cachedScopeObj);
        }

        ssfi->HomeObjId = TTD_INVALID_PTR_ID;
        if (this->GetHomeObj() != nullptr)
        {
            ssfi->HomeObjId = TTD_CONVERT_VAR_TO_PTR_ID(this->GetHomeObj());
        }

        ssfi->ComputedNameInfo = TTD_CONVERT_JSVAR_TO_TTDVAR(this->GetComputedNameVar());
    }